

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wbmp.c
# Opt level: O0

Wbmp * createwbmp(int width,int height,int color)

{
  int iVar1;
  int *piVar2;
  Wbmp *wbmp;
  int i;
  int color_local;
  int height_local;
  int width_local;
  
  _height_local = (Wbmp *)gdMalloc(0x18);
  if (_height_local == (Wbmp *)0x0) {
    _height_local = (Wbmp *)0x0;
  }
  else {
    iVar1 = overflow2(4,width);
    if (iVar1 == 0) {
      iVar1 = overflow2(width << 2,height);
      if (iVar1 == 0) {
        piVar2 = (int *)gdMalloc((long)width * 4 * (long)height);
        _height_local->bitmap = piVar2;
        if (piVar2 == (int *)0x0) {
          gdFree(_height_local);
          _height_local = (Wbmp *)0x0;
        }
        else {
          _height_local->width = width;
          _height_local->height = height;
          wbmp._0_4_ = 0;
          while ((int)wbmp < width * height) {
            _height_local->bitmap[(int)wbmp] = color;
            wbmp._0_4_ = (int)wbmp + 1;
          }
        }
      }
      else {
        gdFree(_height_local);
        _height_local = (Wbmp *)0x0;
      }
    }
    else {
      gdFree(_height_local);
      _height_local = (Wbmp *)0x0;
    }
  }
  return _height_local;
}

Assistant:

Wbmp *createwbmp(int width, int height, int color)
{
	int i;
	Wbmp *wbmp;

	if((wbmp = (Wbmp *)gdMalloc(sizeof (Wbmp))) == NULL) {
		return (NULL);
	}

	if(overflow2(sizeof(int), width)) {
		gdFree(wbmp);
		return NULL;
	}

	if(overflow2(sizeof(int) * width, height)) {
		gdFree(wbmp);
		return NULL;
	}

	if((wbmp->bitmap = (int *)gdMalloc(sizeof(int) * width * height)) == NULL) {
		gdFree(wbmp);
		return NULL;
	}

	wbmp->width = width;
	wbmp->height = height;

	for(i = 0; i < width * height; wbmp->bitmap[i++] = color);

	return wbmp;
}